

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_libc.cc
# Opt level: O0

bool absl::lts_20250127::time_internal::cctz::anon_unknown_10::make_time
               (civil_second *cs,int is_dst,time_t *t,tm *tm)

{
  int iVar1;
  year_t yVar2;
  time_t tVar3;
  tm *ptVar4;
  tm *tmp;
  tm tm2;
  tm *tm_local;
  time_t *t_local;
  int is_dst_local;
  civil_second *cs_local;
  
  tm2.tm_zone = (char *)tm;
  yVar2 = detail::civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::year(cs);
  *(int *)(tm2.tm_zone + 0x14) = (int)yVar2 + -0x76c;
  iVar1 = detail::civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::month(cs)
  ;
  *(int *)(tm2.tm_zone + 0x10) = iVar1 + -1;
  iVar1 = detail::civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::day(cs);
  *(int *)(tm2.tm_zone + 0xc) = iVar1;
  iVar1 = detail::civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::hour(cs);
  *(int *)(tm2.tm_zone + 8) = iVar1;
  iVar1 = detail::civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::minute
                    (cs);
  *(int *)(tm2.tm_zone + 4) = iVar1;
  iVar1 = detail::civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::second
                    (cs);
  *(int *)tm2.tm_zone = iVar1;
  *(int *)(tm2.tm_zone + 0x20) = is_dst;
  tVar3 = mktime((tm *)tm2.tm_zone);
  *t = tVar3;
  if ((*t == -1) &&
     ((((ptVar4 = local_time(t,(tm *)&tmp), ptVar4 == (tm *)0x0 ||
        (ptVar4->tm_year != *(int *)(tm2.tm_zone + 0x14))) ||
       (ptVar4->tm_mon != *(int *)(tm2.tm_zone + 0x10))) ||
      (((ptVar4->tm_mday != *(int *)(tm2.tm_zone + 0xc) ||
        (ptVar4->tm_hour != *(int *)(tm2.tm_zone + 8))) ||
       ((ptVar4->tm_min != *(int *)(tm2.tm_zone + 4) || (ptVar4->tm_sec != *(int *)tm2.tm_zone))))))
     )) {
    cs_local._7_1_ = false;
  }
  else {
    cs_local._7_1_ = true;
  }
  return cs_local._7_1_;
}

Assistant:

bool make_time(const civil_second& cs, int is_dst, std::time_t* t,
               std::tm* tm) {
  tm->tm_year = static_cast<int>(cs.year() - year_t{1900});
  tm->tm_mon = cs.month() - 1;
  tm->tm_mday = cs.day();
  tm->tm_hour = cs.hour();
  tm->tm_min = cs.minute();
  tm->tm_sec = cs.second();
  tm->tm_isdst = is_dst;
  *t = std::mktime(tm);
  if (*t == std::time_t{-1}) {
    std::tm tm2;
    const std::tm* tmp = local_time(t, &tm2);
    if (tmp == nullptr || tmp->tm_year != tm->tm_year ||
        tmp->tm_mon != tm->tm_mon || tmp->tm_mday != tm->tm_mday ||
        tmp->tm_hour != tm->tm_hour || tmp->tm_min != tm->tm_min ||
        tmp->tm_sec != tm->tm_sec) {
      // A true error (not just one second before the epoch).
      return false;
    }
  }
  return true;
}